

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O0

Vec_Ptr_t * Vec_WecConvertToVecPtr(Vec_Wec_t *p)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  Vec_Int_t *pVVar2;
  undefined4 local_24;
  int i;
  Vec_Int_t *vLevel;
  Vec_Ptr_t *vCopy;
  Vec_Wec_t *p_local;
  
  iVar1 = Vec_WecSize(p);
  p_00 = Vec_PtrAlloc(iVar1);
  for (local_24 = 0; iVar1 = Vec_WecSize(p), local_24 < iVar1; local_24 = local_24 + 1) {
    pVVar2 = Vec_WecEntry(p,local_24);
    pVVar2 = Vec_IntDup(pVVar2);
    Vec_PtrPush(p_00,pVVar2);
  }
  return p_00;
}

Assistant:

static inline Vec_Ptr_t * Vec_WecConvertToVecPtr( Vec_Wec_t * p )
{
    Vec_Ptr_t * vCopy;
    Vec_Int_t * vLevel;
    int i;
    vCopy = Vec_PtrAlloc( Vec_WecSize(p) );
    Vec_WecForEachLevel( p, vLevel, i )
        Vec_PtrPush( vCopy, Vec_IntDup(vLevel) );
    return vCopy;
}